

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::PerfectAggregateHashTable::AddChunk
          (PerfectAggregateHashTable *this,DataChunk *groups,DataChunk *payload)

{
  data_ptr_t __s;
  idx_t count;
  long lVar1;
  data_ptr_t pdVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  ulong params;
  byte bVar4;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var5;
  byte bVar6;
  int8_t iVar7;
  uint16_t uVar8;
  int16_t iVar9;
  uint32_t uVar10;
  int32_t iVar11;
  reference pvVar12;
  reference this_00;
  reference this_01;
  int64_t iVar13;
  uint64_t uVar14;
  TupleDataLayout *pTVar15;
  reference aggr;
  AggregateFilterData *filter_data;
  InvalidInputException *this_02;
  InternalException *this_03;
  idx_t iVar16;
  ulong uVar17;
  size_type __n;
  size_type __n_00;
  idx_t iVar18;
  idx_t iVar19;
  Vector *input;
  DataChunk *pDVar20;
  UnifiedVectorFormat vdata;
  undefined1 local_b8 [8];
  _Head_base<0UL,_duckdb::Vector_*,_false> local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  Vector *local_70;
  Aggregates *local_68;
  vector<unsigned_long,_true> *local_60;
  DataChunk *local_58;
  string local_50;
  
  __s = (this->addresses).data;
  local_58 = payload;
  switchD_010444a0::default(__s,0,groups->count << 3);
  if ((groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar19 = this->total_required_bits;
    local_60 = &this->required_bits;
    local_68 = (Aggregates *)&this->group_minima;
    __n = 0;
    local_70 = (Vector *)groups;
    do {
      pvVar12 = vector<unsigned_long,_true>::operator[](local_60,__n);
      iVar19 = iVar19 - *pvVar12;
      this_00 = vector<duckdb::Vector,_true>::operator[](&groups->data,__n);
      this_01 = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)local_68,__n)
      ;
      count = groups->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
      Vector::ToUnifiedFormat(this_00,count,(UnifiedVectorFormat *)local_b8);
      _Var5._M_head_impl = local_b0._M_head_impl;
      bVar4 = (byte)iVar19;
      switch((this_00->type).physical_type_) {
      case UINT8:
        bVar6 = Value::GetValueUnsafe<unsigned_char>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (count != 0) {
            lVar1 = *(long *)local_b8;
            iVar18 = 0;
            do {
              iVar16 = iVar18;
              if (lVar1 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
              }
              *(ulong *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   (((ulong)(&(_Var5._M_head_impl)->vector_type)[iVar16] - (ulong)bVar6) + 1 <<
                   (bVar4 & 0x3f));
              iVar18 = iVar18 + 1;
            } while (count != iVar18);
          }
        }
        else if (count != 0) {
          lVar1 = *(long *)local_b8;
          iVar18 = 0;
          do {
            iVar16 = iVar18;
            if (lVar1 != 0) {
              iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar16 >> 6) * 8) >> (iVar16 & 0x3f) &
                1) != 0) {
              *(ulong *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   (((ulong)(&(_Var5._M_head_impl)->vector_type)[iVar16] - (ulong)bVar6) + 1 <<
                   (bVar4 & 0x3f));
            }
            iVar18 = iVar18 + 1;
          } while (count != iVar18);
        }
        break;
      case INT8:
        iVar7 = Value::GetValueUnsafe<signed_char>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (count != 0) {
            lVar1 = *(long *)local_b8;
            iVar18 = 0;
            do {
              iVar16 = iVar18;
              if (lVar1 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
              }
              *(long *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   (((long)(char)(&(_Var5._M_head_impl)->vector_type)[iVar16] - (long)iVar7) + 1 <<
                   (bVar4 & 0x3f));
              iVar18 = iVar18 + 1;
            } while (count != iVar18);
          }
        }
        else if (count != 0) {
          lVar1 = *(long *)local_b8;
          iVar18 = 0;
          do {
            iVar16 = iVar18;
            if (lVar1 != 0) {
              iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar16 >> 6) * 8) >> (iVar16 & 0x3f) &
                1) != 0) {
              *(long *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   (((long)(char)(&(_Var5._M_head_impl)->vector_type)[iVar16] - (long)iVar7) + 1 <<
                   (bVar4 & 0x3f));
            }
            iVar18 = iVar18 + 1;
          } while (count != iVar18);
        }
        break;
      case UINT16:
        uVar8 = Value::GetValueUnsafe<unsigned_short>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (count != 0) {
            lVar1 = *(long *)local_b8;
            iVar18 = 0;
            do {
              iVar16 = iVar18;
              if (lVar1 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
              }
              *(ulong *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   (((ulong)*(ushort *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 2) -
                    (ulong)uVar8) + 1 << (bVar4 & 0x3f));
              iVar18 = iVar18 + 1;
            } while (count != iVar18);
          }
        }
        else if (count != 0) {
          lVar1 = *(long *)local_b8;
          iVar18 = 0;
          do {
            iVar16 = iVar18;
            if (lVar1 != 0) {
              iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar16 >> 6) * 8) >> (iVar16 & 0x3f) &
                1) != 0) {
              *(ulong *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   (((ulong)*(ushort *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 2) -
                    (ulong)uVar8) + 1 << (bVar4 & 0x3f));
            }
            iVar18 = iVar18 + 1;
          } while (count != iVar18);
        }
        break;
      case INT16:
        iVar9 = Value::GetValueUnsafe<short>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (count != 0) {
            lVar1 = *(long *)local_b8;
            iVar18 = 0;
            do {
              iVar16 = iVar18;
              if (lVar1 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
              }
              *(long *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   (((long)*(short *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 2) - (long)iVar9
                    ) + 1 << (bVar4 & 0x3f));
              iVar18 = iVar18 + 1;
            } while (count != iVar18);
          }
        }
        else if (count != 0) {
          lVar1 = *(long *)local_b8;
          iVar18 = 0;
          do {
            iVar16 = iVar18;
            if (lVar1 != 0) {
              iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar16 >> 6) * 8) >> (iVar16 & 0x3f) &
                1) != 0) {
              *(long *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   (((long)*(short *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 2) - (long)iVar9
                    ) + 1 << (bVar4 & 0x3f));
            }
            iVar18 = iVar18 + 1;
          } while (count != iVar18);
        }
        break;
      case UINT32:
        uVar10 = Value::GetValueUnsafe<unsigned_int>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (count != 0) {
            lVar1 = *(long *)local_b8;
            iVar18 = 0;
            do {
              iVar16 = iVar18;
              if (lVar1 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
              }
              *(ulong *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   ((ulong)((*(int *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 4) - uVar10) + 1
                           ) << (bVar4 & 0x3f));
              iVar18 = iVar18 + 1;
            } while (count != iVar18);
          }
        }
        else if (count != 0) {
          lVar1 = *(long *)local_b8;
          iVar18 = 0;
          do {
            iVar16 = iVar18;
            if (lVar1 != 0) {
              iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar16 >> 6) * 8) >> (iVar16 & 0x3f) &
                1) != 0) {
              *(ulong *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   ((ulong)((*(int *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 4) - uVar10) + 1
                           ) << (bVar4 & 0x3f));
            }
            iVar18 = iVar18 + 1;
          } while (count != iVar18);
        }
        break;
      case INT32:
        iVar11 = Value::GetValueUnsafe<int>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (count != 0) {
            lVar1 = *(long *)local_b8;
            iVar18 = 0;
            do {
              iVar16 = iVar18;
              if (lVar1 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
              }
              *(long *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   ((long)((*(int *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 4) - iVar11) + 1)
                   << (bVar4 & 0x3f));
              iVar18 = iVar18 + 1;
            } while (count != iVar18);
          }
        }
        else if (count != 0) {
          lVar1 = *(long *)local_b8;
          iVar18 = 0;
          do {
            iVar16 = iVar18;
            if (lVar1 != 0) {
              iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar16 >> 6) * 8) >> (iVar16 & 0x3f) &
                1) != 0) {
              *(long *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   ((long)((*(int *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 4) - iVar11) + 1)
                   << (bVar4 & 0x3f));
            }
            iVar18 = iVar18 + 1;
          } while (count != iVar18);
        }
        break;
      case UINT64:
        uVar14 = Value::GetValueUnsafe<unsigned_long>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (count != 0) {
            lVar1 = *(long *)local_b8;
            iVar18 = 0;
            do {
              iVar16 = iVar18;
              if (lVar1 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
              }
              *(uint64_t *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   ((*(long *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 8) - uVar14) + 1 <<
                   (bVar4 & 0x3f));
              iVar18 = iVar18 + 1;
            } while (count != iVar18);
          }
        }
        else if (count != 0) {
          lVar1 = *(long *)local_b8;
          iVar18 = 0;
          do {
            iVar16 = iVar18;
            if (lVar1 != 0) {
              iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar16 >> 6) * 8) >> (iVar16 & 0x3f) &
                1) != 0) {
              *(uint64_t *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   ((*(long *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 8) - uVar14) + 1 <<
                   (bVar4 & 0x3f));
            }
            iVar18 = iVar18 + 1;
          } while (count != iVar18);
        }
        break;
      case INT64:
        iVar13 = Value::GetValueUnsafe<long>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (count != 0) {
            lVar1 = *(long *)local_b8;
            iVar18 = 0;
            do {
              iVar16 = iVar18;
              if (lVar1 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
              }
              *(long *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   ((*(long *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 8) - iVar13) + 1 <<
                   (bVar4 & 0x3f));
              iVar18 = iVar18 + 1;
            } while (count != iVar18);
          }
        }
        else if (count != 0) {
          lVar1 = *(long *)local_b8;
          iVar18 = 0;
          do {
            iVar16 = iVar18;
            if (lVar1 != 0) {
              iVar16 = (idx_t)*(uint *)(lVar1 + iVar18 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar16 >> 6) * 8) >> (iVar16 & 0x3f) &
                1) != 0) {
              *(long *)(__s + iVar18 * 8) =
                   *(long *)(__s + iVar18 * 8) +
                   ((*(long *)(&(_Var5._M_head_impl)->vector_type + iVar16 * 8) - iVar13) + 1 <<
                   (bVar4 & 0x3f));
            }
            iVar18 = iVar18 + 1;
          } while (count != iVar18);
        }
        break;
      default:
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Unsupported group type for perfect aggregate hash table","")
        ;
        InternalException::InternalException(this_03,&local_50);
        __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
      }
      groups = (DataChunk *)local_70;
      if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(((vector<duckdb::Vector,_true> *)&((Vector *)groups)->vector_type
                                   )->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>)
                                  .
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(((vector<duckdb::Vector,_true> *)&((Vector *)groups)->vector_type
                                   )->super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>)
                                  .
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  if (groups->count != 0) {
    pdVar2 = this->data;
    _Var3._M_head_impl =
         (this->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    uVar17 = 0;
    do {
      params = *(ulong *)(__s + uVar17 * 8);
      if (this->total_groups <= params) {
        this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_b8 = (undefined1  [8])&local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,
                   "Perfect hash aggregate: aggregate group %llu exceeded total groups %llu. This likely means that the statistics in your data source are corrupt.\n* PRAGMA disable_optimizer to disable optimizations that rely on correct statistics"
                   ,"");
        InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                  (this_02,(string *)local_b8,params,this->total_groups);
        __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      _Var3._M_head_impl[params] = true;
      *(data_ptr_t *)(__s + uVar17 * 8) = pdVar2 + params * this->tuple_size;
      uVar17 = uVar17 + 1;
    } while (uVar17 < groups->count);
  }
  pTVar15 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                      (&(this->super_BaseAggregateHashTable).layout_ptr);
  local_b8 = (undefined1  [8])
             unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
             operator*(&this->aggregate_allocator);
  local_b0._M_head_impl = (Vector *)0x0;
  if ((pTVar15->aggregates).
      super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
      super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pTVar15->aggregates).
      super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
      super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_70 = &this->addresses;
    local_68 = &pTVar15->aggregates;
    __n_00 = 0;
    iVar19 = 0;
    do {
      aggr = vector<duckdb::AggregateObject,_true>::operator[](local_68,__n_00);
      pDVar20 = local_58;
      input = local_70;
      local_60 = (vector<unsigned_long,_true> *)aggr->child_count;
      if (aggr->filter == (Expression *)0x0) {
        RowOperations::UpdateStates
                  ((RowOperationsState *)local_b8,aggr,local_70,local_58,iVar19,local_58->count);
      }
      else {
        filter_data = AggregateFilterDataSet::GetFilterData
                                (&(this->super_BaseAggregateHashTable).filter_set,__n_00);
        pDVar20 = local_58;
        input = local_70;
        RowOperations::UpdateFilteredStates
                  ((RowOperationsState *)local_b8,filter_data,aggr,local_70,local_58,iVar19);
      }
      VectorOperations::AddInPlace(input,aggr->payload_size,pDVar20->count);
      iVar19 = (long)&(local_60->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar19;
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(pTVar15->aggregates).
                                     super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     .
                                     super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar15->aggregates).
                                     super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     .
                                     super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             0x2e8ba2e8ba2e8ba3));
    if (local_b0._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_b0,local_b0._M_head_impl);
    }
  }
  return;
}

Assistant:

void PerfectAggregateHashTable::AddChunk(DataChunk &groups, DataChunk &payload) {
	// first we need to find the location in the HT of each of the groups
	auto address_data = FlatVector::GetData<uintptr_t>(addresses);
	// zero-initialize the address data
	memset(address_data, 0, groups.size() * sizeof(uintptr_t));
	D_ASSERT(groups.ColumnCount() == group_minima.size());

	// then compute the actual group location by iterating over each of the groups
	idx_t current_shift = total_required_bits;
	for (idx_t i = 0; i < groups.ColumnCount(); i++) {
		current_shift -= required_bits[i];
		ComputeGroupLocation(groups.data[i], group_minima[i], address_data, current_shift, groups.size());
	}
	// now we have the HT entry number for every tuple
	// compute the actual pointer to the data by adding it to the base HT pointer and multiplying by the tuple size
	for (idx_t i = 0; i < groups.size(); i++) {
		const auto group = address_data[i];
		if (group >= total_groups) {
			throw InvalidInputException("Perfect hash aggregate: aggregate group %llu exceeded total groups %llu. This "
			                            "likely means that the statistics in your data source are corrupt.\n* PRAGMA "
			                            "disable_optimizer to disable optimizations that rely on correct statistics",
			                            group, total_groups);
		}
		group_is_set[group] = true;
		address_data[i] = uintptr_t(data) + group * tuple_size;
	}

	// after finding the group location we update the aggregates
	idx_t payload_idx = 0;
	auto &aggregates = layout_ptr->GetAggregates();
	RowOperationsState row_state(*aggregate_allocator);
	for (idx_t aggr_idx = 0; aggr_idx < aggregates.size(); aggr_idx++) {
		auto &aggregate = aggregates[aggr_idx];
		auto input_count = (idx_t)aggregate.child_count;
		if (aggregate.filter) {
			RowOperations::UpdateFilteredStates(row_state, filter_set.GetFilterData(aggr_idx), aggregate, addresses,
			                                    payload, payload_idx);
		} else {
			RowOperations::UpdateStates(row_state, aggregate, addresses, payload, payload_idx, payload.size());
		}
		// move to the next aggregate
		payload_idx += input_count;
		VectorOperations::AddInPlace(addresses, UnsafeNumericCast<int64_t>(aggregate.payload_size), payload.size());
	}
}